

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O3

int message_get_properties(MESSAGE_HANDLE message,PROPERTIES_HANDLE *properties)

{
  LOGGER_LOG p_Var1;
  PROPERTIES_HANDLE pPVar2;
  int iVar3;
  
  if (message == (MESSAGE_HANDLE)0x0 || properties == (PROPERTIES_HANDLE *)0x0) {
    p_Var1 = xlogging_get_log_function();
    iVar3 = 0x30e;
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/message.c"
                ,"message_get_properties",0x30d,1,"Bad arguments: message = %p, properties = %p",
                message,properties);
    }
  }
  else if (message->properties == (PROPERTIES_HANDLE)0x0) {
    *properties = (PROPERTIES_HANDLE)0x0;
    iVar3 = 0;
  }
  else {
    pPVar2 = properties_clone(message->properties);
    *properties = pPVar2;
    iVar3 = 0;
    if (pPVar2 == (PROPERTIES_HANDLE)0x0) {
      p_Var1 = xlogging_get_log_function();
      iVar3 = 0x323;
      if (p_Var1 != (LOGGER_LOG)0x0) {
        (*p_Var1)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/message.c"
                  ,"message_get_properties",0x322,1,"Cannot clone message properties");
      }
    }
  }
  return iVar3;
}

Assistant:

int message_get_properties(MESSAGE_HANDLE message, PROPERTIES_HANDLE* properties)
{
    int result;

    if ((message == NULL) ||
        (properties == NULL))
    {
        /* Codes_SRS_MESSAGE_01_059: [ If `message` or `properties` is NULL, `message_get_properties` shall fail and return a non-zero value. ]*/
        LogError("Bad arguments: message = %p, properties = %p",
            message, properties);
        result = MU_FAILURE;
    }
    else
    {
        if (message->properties == NULL)
        {
            /* Codes_SRS_MESSAGE_01_148: [ If no message properties have been set, `message_get_properties` shall set `properties` to NULL. ]*/
            *properties = NULL;

            /* Codes_SRS_MESSAGE_01_058: [ On success, `message_get_properties` shall return 0. ]*/
            result = 0;
        }
        else
        {
            /* Codes_SRS_MESSAGE_01_057: [ `message_get_properties` shall copy the contents of message properties for the message instance identified by `message` into the argument `properties`. ]*/
            /* Codes_SRS_MESSAGE_01_060: [ Cloning the message properties shall be done by calling `properties_clone`. ]*/
            *properties = properties_clone(message->properties);
            if (*properties == NULL)
            {
                /* Codes_SRS_MESSAGE_01_061: [ If `properties_clone` fails, `message_get_properties` shall fail and return a non-zero value. ]*/
                LogError("Cannot clone message properties");
                result = MU_FAILURE;
            }
            else
            {
                /* Codes_SRS_MESSAGE_01_058: [ On success, `message_get_properties` shall return 0. ]*/
                result = 0;
            }
        }
    }

    return result;
}